

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_service.c
# Opt level: O2

MPP_RET mpp_service_detach(void *ctx)

{
  MPP_RET MVar1;
  
  if (*(int *)((long)ctx + 0x34) == 0) {
    MVar1 = MPP_OK;
    if (*(int *)((long)ctx + 0x18) != 0) {
      mpp_server_detach(ctx);
      MVar1 = MPP_OK;
    }
  }
  else {
    _mpp_log_l(2,"mpp_serivce","can not switch off bat mode when service working\n",
               "mpp_service_detach");
    MVar1 = MPP_NOK;
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_service_detach(void *ctx)
{
    MppDevMppService *p = (MppDevMppService *)ctx;

    if (p->req_cnt) {
        mpp_err_f("can not switch off bat mode when service working\n");
        return MPP_NOK;
    }

    if (p->batch_io)
        mpp_server_detach(p);

    return MPP_OK;
}